

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin_kmp.cpp
# Opt level: O2

string * __thiscall
flatbuffers::kotlin::KotlinKMPGenerator::GenDefaultValue_abi_cxx11_
          (string *__return_storage_ptr__,KotlinKMPGenerator *this,FieldDef *field)

{
  BaseType BVar1;
  BaseType BVar2;
  EnumDef *pEVar3;
  bool bVar4;
  uint uVar5;
  Type *type;
  char *pcVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  string suffix;
  string field_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_108;
  string local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48 [32];
  
  BVar1 = (field->value).type.base_type;
  std::__cxx11::string::string(local_48,(string *)field);
  LiteralSuffix_abi_cxx11_(&local_e8,(KotlinKMPGenerator *)&field->value,type);
  BVar2 = (field->value).type.base_type;
  if ((BVar2 - BASE_TYPE_UTYPE < 0xc) && (field->presence == kOptional)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"null",(allocator<char> *)&bStack_108);
    goto LAB_0019c45f;
  }
  if (BVar1 - BASE_TYPE_FLOAT < 2) {
    FloatConstantGenerator::GenFloatConstant_abi_cxx11_
              (__return_storage_ptr__,
               (FloatConstantGenerator *)(anonymous_namespace)::KotlinFloatGen,field);
    if ((BVar1 == BASE_TYPE_DOUBLE) &&
       ((__return_storage_ptr__->_M_dataplus)._M_p[__return_storage_ptr__->_M_string_length - 1] ==
        'f')) {
      std::__cxx11::string::pop_back();
    }
    goto LAB_0019c45f;
  }
  if (BVar1 == BASE_TYPE_BOOL) {
    bVar4 = std::operator==(&(field->value).constant,"0");
    pcVar6 = "true";
    if (bVar4) {
      pcVar6 = "false";
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,pcVar6,(allocator<char> *)&bStack_108);
    goto LAB_0019c45f;
  }
  pEVar3 = (field->value).type.enum_def;
  if (BVar2 - BASE_TYPE_UTYPE < 10 && pEVar3 != (EnumDef *)0x0) {
LAB_0019c549:
    std::operator+(&local_68,&(field->value).constant,&local_e8);
    WrapEnumValue(__return_storage_ptr__,this,&(field->value).type,&local_68);
    this_00 = &local_68;
LAB_0019c583:
    std::__cxx11::string::~string((string *)this_00);
    goto LAB_0019c45f;
  }
  if ((BVar2 != BASE_TYPE_VECTOR64) && (BVar2 != BASE_TYPE_VECTOR)) {
switchD_0019c5a0_caseD_2:
    std::operator+(__return_storage_ptr__,&(field->value).constant,&local_e8);
    goto LAB_0019c45f;
  }
  uVar5 = (field->value).type.element - BASE_TYPE_UTYPE;
  if (uVar5 < 10 && pEVar3 != (EnumDef *)0x0) goto LAB_0019c549;
  switch(uVar5) {
  case 0:
    (*(this->namer_).super_Namer._vptr_Namer[0xf])(&local_c8,&this->namer_);
    std::operator+(&local_a8,&local_c8,"(");
    std::operator+(&local_88,&local_a8,&(field->value).constant);
    std::operator+(&bStack_108,&local_88,&local_e8);
    std::operator+(__return_storage_ptr__,&bStack_108,")");
    std::__cxx11::string::~string((string *)&bStack_108);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_a8);
    this_00 = &local_c8;
    goto LAB_0019c583;
  case 1:
    bVar4 = std::operator==(&(field->value).constant,"0");
    pcVar6 = "true";
    if (bVar4) {
      pcVar6 = "false";
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,pcVar6,(allocator<char> *)&bStack_108);
    goto LAB_0019c45f;
  default:
    goto switchD_0019c5a0_caseD_2;
  case 10:
    pcVar6 = "f";
    break;
  case 0xb:
    pcVar6 = ".toDouble()";
    break;
  case 0xc:
  case 0xe:
  case 0xf:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"null",(allocator<char> *)&bStack_108);
    goto LAB_0019c45f;
  }
  std::operator+(__return_storage_ptr__,&(field->value).constant,pcVar6);
LAB_0019c45f:
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string(local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string GenDefaultValue(const FieldDef &field) const {
    auto &value = field.value;
    auto base_type = value.type.base_type;
    auto field_name = field.name;
    std::string suffix = LiteralSuffix(value.type);
    if (field.IsScalarOptional()) { return "null"; }
    if (IsFloat(base_type)) {
      auto val = KotlinFloatGen.GenFloatConstant(field);
      if (base_type == BASE_TYPE_DOUBLE && val.back() == 'f') {
        val.pop_back();
      }
      return val;
    }

    if (base_type == BASE_TYPE_BOOL) {
      return value.constant == "0" ? "false" : "true";
    }

    if (IsEnum(field.value.type) ||
        (IsVector(field.value.type) && IsEnum(field.value.type.VectorType()))) {
      return WrapEnumValue(field.value.type, value.constant + suffix);
    }

    if (IsVector(field.value.type) &&
        (field.value.type.VectorType().base_type == BASE_TYPE_UNION ||
         field.value.type.VectorType().base_type == BASE_TYPE_STRUCT ||
         field.value.type.VectorType().base_type == BASE_TYPE_STRING)) {
      return "null";
    }
    if (IsVector(field.value.type)) {
      switch (field.value.type.element) {
        case BASE_TYPE_UTYPE:
          return namer_.Type(*field.value.type.enum_def) + "(" +
                 value.constant + suffix + ")";
        case BASE_TYPE_UNION:
        case BASE_TYPE_STRUCT:
        case BASE_TYPE_STRING: return "null";
        case BASE_TYPE_BOOL: return value.constant == "0" ? "false" : "true";
        case BASE_TYPE_FLOAT: return value.constant + "f";
        case BASE_TYPE_DOUBLE: {
          return value.constant + ".toDouble()";
        }
        default: return value.constant + suffix;
      }
    }
    return value.constant + suffix;
  }